

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *result_type,uint32_t argument
          )

{
  SPIRType *pSVar1;
  char (*in_R9) [2];
  string op;
  string local_68;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pSVar1 = Compiler::expression_type(&this->super_Compiler,argument);
  (*(this->super_Compiler)._vptr_Compiler[0x3b])(&local_48,this,result_type,pSVar1);
  if (local_40 == 0) {
    to_enclosed_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,argument,true);
  }
  else {
    to_unpacked_expression_abi_cxx11_(&local_68,this,argument,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x309149,
               (char (*) [2])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314a82,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl(const SPIRType &result_type, uint32_t argument)
{
	auto op = bitcast_glsl_op(result_type, expression_type(argument));
	if (op.empty())
		return to_enclosed_unpacked_expression(argument);
	else
		return join(op, "(", to_unpacked_expression(argument), ")");
}